

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

bool GetUniquePathFromEnv(char *env_name,char *path)

{
  char *pcVar1;
  char *pcVar2;
  char *__s;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  bool local_17a;
  char local_178 [7];
  bool childBitDetected;
  char forceVarName [256];
  tuple<bool_&,_const_char_*&,_const_char_*&> local_70;
  tuple<bool,_const_char_*,_const_char_*> local_58;
  bool local_39;
  char *pcStack_38;
  bool pidIsForced;
  char *append2;
  char *append1;
  char *envval;
  char *path_local;
  char *env_name_local;
  
  envval = path;
  path_local = env_name;
  append1 = getenv(env_name);
  if ((append1 == (char *)0x0) || (*append1 == '\0')) {
    env_name_local._7_1_ = false;
  }
  else {
    append2 = "";
    pcStack_38 = "";
    QueryHPCEnvironment();
    std::tie<bool,char_const*,char_const*>(&local_70,&local_39,&append2,&stack0xffffffffffffffc8);
    std::tuple<bool&,char_const*&,char_const*&>::operator=
              ((tuple<bool&,char_const*&,char_const*&> *)&local_70,&local_58);
    snprintf(local_178,0x100,"%s_USE_PID",path_local);
    local_17a = true;
    if ((local_39 & 1U) == 0) {
      pcVar4 = getenv(local_178);
      local_17a = tcmalloc::commandlineflags::StringToBool(pcVar4,false);
    }
    __s = envval;
    pcVar2 = append1;
    pcVar1 = append2;
    pcVar4 = pcStack_38;
    local_39 = local_17a;
    bVar5 = ((int)*append1 & 0x80U) != 0;
    *append1 = *append1 & 0x7f;
    if ((local_17a != false) || (bVar5)) {
      iVar3 = anon_unknown.dwarf_1952e::GetPID();
      snprintf(__s,0x1000,"%s%s%s_%d",pcVar2,pcVar1,pcVar4,iVar3);
    }
    else {
      snprintf(envval,0x1000,"%s%s%s",append1,append2,pcStack_38);
    }
    if ((bVar5) || ((local_39 & 1U) == 0)) {
      *append1 = *append1 | 0x80;
    }
    env_name_local._7_1_ = true;
  }
  return env_name_local._7_1_;
}

Assistant:

bool GetUniquePathFromEnv(const char* env_name, char* path) {
  char* envval = getenv(env_name);

  if (envval == nullptr || *envval == '\0') {
    return false;
  }

  const char* append1 = "";
  const char* append2 = "";
  bool pidIsForced;
  std::tie(pidIsForced, append1, append2) = QueryHPCEnvironment();

  // Generate the "forcing" environment variable name in a form of
  // <ORIG_ENVAR>_USE_PID that requests PID to be used in the file names
  char forceVarName[256];
  snprintf(forceVarName, sizeof(forceVarName), "%s_USE_PID", env_name);

  pidIsForced = pidIsForced || EnvToBool(forceVarName, false);

  // Get information about the child bit and drop it
  const bool childBitDetected = (*envval & 128) != 0;
  *envval &= ~128;

  if (pidIsForced || childBitDetected) {
    snprintf(path, PATH_MAX, "%s%s%s_%d",
             envval, append1, append2, GetPID());
  } else {
    snprintf(path, PATH_MAX, "%s%s%s", envval, append1, append2);
  }

  // Set the child bit for the fork'd processes, unless appending pid
  // was forced by either _USE_PID thingy or via MPI detection stuff.
  if (childBitDetected || !pidIsForced) {
    *envval |= 128;
  }
  return true;
}